

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O2

Definitions * __thiscall
dg::dda::MemorySSATransformation::getBBlockDefinitions
          (MemorySSATransformation *this,RWBBlock *b,DefSite *ds)

{
  RWNodeCall *C;
  BBlockInfo *D;
  
  D = getBBlockInfo(this,b);
  if ((D->definitions)._processed == false) {
    C = D->call;
    if (C == (RWNodeCall *)0x0) {
      performLvn(&D->definitions,b);
    }
    else if (ds == (DefSite *)0x0) {
      fillDefinitionsFromCall(this,&D->definitions,C);
    }
    else {
      fillDefinitionsFromCall(this,&D->definitions,C,ds);
    }
  }
  return &D->definitions;
}

Assistant:

Definitions &MemorySSATransformation::getBBlockDefinitions(RWBBlock *b,
                                                           const DefSite *ds) {
    auto &bi = getBBlockInfo(b);
    auto &D = bi.getDefinitions();

    if (D.isProcessed()) {
        DBG(dda, "Retrived processed definitions for block " << b->getID());
        return D;
    }

    if (bi.isCallBlock()) {
        if (ds) {
            fillDefinitionsFromCall(D, bi.getCall(), *ds);
            DBG(dda,
                "Retrived (partial) definitions for call block " << b->getID());
        } else {
            DBG(dda, "Filling all definitions for call block " << b->getID());
            fillDefinitionsFromCall(D, bi.getCall());
            assert(D.isProcessed());
        }
    } else {
        performLvn(D, b); // normal basic block
        assert(D.isProcessed());
        DBG(dda, "Retrived LVN'd definitions for block " << b->getID());
    }
    return D;
}